

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_reap_children(void)

{
  int iVar1;
  int *piVar2;
  undefined1 local_a0 [8];
  sigaction sa;
  
  if (fio_old_sig_chld.__sigaction_handler.sa_handler == (__sighandler_t)0x0) {
    local_a0 = (undefined1  [8])reap_child_handler;
    sigemptyset((sigset_t *)&sa);
    sa.sa_mask.__val[0xf]._0_4_ = 0x10000001;
    iVar1 = sigaction(0x11,(sigaction *)local_a0,(sigaction *)&fio_old_sig_chld);
    if (iVar1 == -1) {
      perror("Child reaping initialization failed");
      kill(0,2);
      piVar2 = __errno_location();
      exit(*piVar2);
    }
  }
  return;
}

Assistant:

void fio_reap_children(void) {
  struct sigaction sa;
  if (fio_old_sig_chld.sa_handler)
    return;
  sa.sa_handler = reap_child_handler;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = SA_RESTART | SA_NOCLDSTOP;
  if (sigaction(SIGCHLD, &sa, &fio_old_sig_chld) == -1) {
    perror("Child reaping initialization failed");
    kill(0, SIGINT);
    exit(errno);
  }
}